

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.c
# Opt level: O3

void aom_fft4x4_float_c(float *input,float *temp,float *output)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int y;
  float *pfVar4;
  float *pfVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  _y = -0x10;
  do {
    fVar9 = *(float *)((long)input + _y + 0x10);
    fVar1 = *(float *)((long)input + _y + 0x20);
    fVar2 = *(float *)((long)input + _y + 0x30);
    fVar3 = *(float *)((long)input + _y + 0x40);
    fVar11 = fVar9 + fVar2;
    fVar10 = fVar1 + fVar3;
    *(float *)((long)output + _y + 0x10) = fVar11 + fVar10;
    *(float *)((long)output + _y + 0x20) = fVar9 - fVar2;
    *(float *)((long)output + _y + 0x30) = fVar11 - fVar10;
    *(float *)((long)output + _y + 0x40) = (fVar3 - fVar1) + 0.0;
    _y = _y + 4;
  } while (_y != 0);
  _y = 0;
  pfVar4 = temp;
  pfVar5 = output;
  do {
    lVar6 = 0;
    do {
      *(float *)((long)pfVar4 + lVar6) = pfVar5[lVar6];
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0x10);
    _y = _y + 1;
    pfVar5 = pfVar5 + 1;
    pfVar4 = pfVar4 + 4;
  } while (_y != 4);
  _y = -0x10;
  do {
    fVar9 = *(float *)((long)temp + _y + 0x10);
    fVar1 = *(float *)((long)temp + _y + 0x20);
    fVar2 = *(float *)((long)temp + _y + 0x30);
    fVar3 = *(float *)((long)temp + _y + 0x40);
    fVar11 = fVar9 + fVar2;
    fVar10 = fVar1 + fVar3;
    *(float *)((long)output + _y + 0x10) = fVar11 + fVar10;
    *(float *)((long)output + _y + 0x20) = fVar9 - fVar2;
    *(float *)((long)output + _y + 0x30) = fVar11 - fVar10;
    *(float *)((long)output + _y + 0x40) = (fVar3 - fVar1) + 0.0;
    _y = _y + 4;
  } while (_y != 0);
  _y = 0;
  pfVar4 = temp;
  pfVar5 = output;
  do {
    lVar6 = 0;
    do {
      *(float *)((long)pfVar4 + lVar6) = pfVar5[lVar6];
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0x10);
    _y = _y + 1;
    pfVar5 = pfVar5 + 1;
    pfVar4 = pfVar4 + 4;
  } while (_y != 4);
  pfVar4 = output + 1;
  _y = 0;
  lVar6 = 0;
  do {
    lVar7 = 0x18;
    do {
      fVar9 = *(float *)((long)temp + lVar7 * 2 + -0x30);
      if (lVar7 == 0x1a && lVar6 == 1) {
        output[10] = fVar9 - *(float *)((long)temp + lVar7 * 2 + -8);
        output[0xb] = *(float *)((long)temp + lVar7 * 2 + -0x10) +
                      *(float *)((long)temp + lVar7 * 2 + -0x28);
        fVar9 = *(float *)((long)temp + lVar7 * 2 + -8);
LAB_00493615:
        output[lVar7] = fVar9 + *(float *)((long)temp + lVar7 * 2 + -0x30);
        fVar9 = *(float *)((long)temp + lVar7 * 2 + -0x28);
        lVar8 = 0x1a;
LAB_0049362f:
        fVar9 = fVar9 - *(float *)((long)temp + lVar7 * 2 + -0x10);
      }
      else {
        pfVar4[lVar7 + -0x19] = fVar9;
        if (lVar6 == 1) {
          fVar1 = *(float *)((long)temp + lVar7 * 2 + -0x10);
          if (lVar7 == 0x1a) {
            output[0xb] = fVar1 + temp[3];
            fVar9 = 0.0;
            goto LAB_00493615;
          }
          fVar9 = 0.0;
          pfVar4[lVar7 + -0x18] = fVar1 + 0.0;
          output[lVar7] = *(float *)((long)temp + lVar7 * 2 + -0x30) + 0.0;
          lVar8 = lVar7;
          goto LAB_0049362f;
        }
        lVar8 = _y + lVar7 + -0x18;
        fVar9 = 0.0;
        if (lVar7 == 0x1a) {
          fVar9 = temp[3] + 0.0;
        }
      }
      output[lVar8 + 1] = fVar9;
      lVar7 = lVar7 + 2;
    } while (lVar7 != 0x1e);
    lVar6 = lVar6 + 1;
    temp = temp + 4;
    _y = _y + 8;
    pfVar4 = pfVar4 + 8;
    if (lVar6 == 3) {
      return;
    }
  } while( true );
}

Assistant:

void aom_fft4x4_float_c(const float *input, float *temp, float *output) {
  aom_fft_2d_gen(input, temp, output, 4, aom_fft1d_4_float, simple_transpose,
                 unpack_2d_output, 1);
}